

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O0

int __thiscall ArmParser::decodeCondition(ArmParser *this,string *text,size_t *pos)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  char c2;
  char c1;
  size_t *pos_local;
  string *text_local;
  ArmParser *this_local;
  
  sVar3 = *pos;
  uVar4 = std::__cxx11::string::size();
  if (sVar3 + 2 <= uVar4) {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)text);
    cVar1 = *pcVar5;
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)text);
    cVar2 = *pcVar5;
    *pos = *pos + 2;
    if ((cVar1 == 'e') && (cVar2 == 'q')) {
      return 0;
    }
    if ((cVar1 == 'n') && (cVar2 == 'e')) {
      return 1;
    }
    if ((cVar1 == 'c') && (cVar2 == 's')) {
      return 2;
    }
    if ((cVar1 == 'h') && (cVar2 == 's')) {
      return 2;
    }
    if ((cVar1 == 'c') && (cVar2 == 'c')) {
      return 3;
    }
    if ((cVar1 == 'l') && (cVar2 == 'o')) {
      return 3;
    }
    if ((cVar1 == 'm') && (cVar2 == 'i')) {
      return 4;
    }
    if ((cVar1 == 'p') && (cVar2 == 'l')) {
      return 5;
    }
    if ((cVar1 == 'v') && (cVar2 == 's')) {
      return 6;
    }
    if ((cVar1 == 'v') && (cVar2 == 'c')) {
      return 7;
    }
    if ((cVar1 == 'h') && (cVar2 == 'i')) {
      return 8;
    }
    if ((cVar1 == 'l') && (cVar2 == 's')) {
      return 9;
    }
    if ((cVar1 == 'g') && (cVar2 == 'e')) {
      return 10;
    }
    if ((cVar1 == 'l') && (cVar2 == 't')) {
      return 0xb;
    }
    if ((cVar1 == 'g') && (cVar2 == 't')) {
      return 0xc;
    }
    if ((cVar1 == 'l') && (cVar2 == 'e')) {
      return 0xd;
    }
    if ((cVar1 == 'a') && (cVar2 == 'l')) {
      return 0xe;
    }
    *pos = *pos - 2;
  }
  return 0xe;
}

Assistant:

int ArmParser::decodeCondition(const std::string& text, size_t& pos)
{
	if (pos+2 <= text.size())
	{
		char c1 = text[pos+0];
		char c2 = text[pos+1];
		pos += 2;

		if (c1 == 'e' && c2 == 'q') return 0;
		if (c1 == 'n' && c2 == 'e') return 1;
		if (c1 == 'c' && c2 == 's') return 2;
		if (c1 == 'h' && c2 == 's') return 2;
		if (c1 == 'c' && c2 == 'c') return 3;
		if (c1 == 'l' && c2 == 'o') return 3;
		if (c1 == 'm' && c2 == 'i') return 4;
		if (c1 == 'p' && c2 == 'l') return 5;
		if (c1 == 'v' && c2 == 's') return 6;
		if (c1 == 'v' && c2 == 'c') return 7;
		if (c1 == 'h' && c2 == 'i') return 8;
		if (c1 == 'l' && c2 == 's') return 9;
		if (c1 == 'g' && c2 == 'e') return 10;
		if (c1 == 'l' && c2 == 't') return 11;
		if (c1 == 'g' && c2 == 't') return 12;
		if (c1 == 'l' && c2 == 'e') return 13;
		if (c1 == 'a' && c2 == 'l') return 14;

		pos -= 2;
	}

	return 14;
}